

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::MethodOptions::SharedCtor(MethodOptions *this,Arena *arena)

{
  Arena *arena_local;
  MethodOptions *this_local;
  
  MessageLite::internal_visibility();
  Impl_::Impl_((Impl_ *)&this->field_0);
  memset((void *)((long)&this->field_0 + 0x38),0,0x10);
  return;
}

Assistant:

inline void MethodOptions::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, features_),
           0,
           offsetof(Impl_, idempotency_level_) -
               offsetof(Impl_, features_) +
               sizeof(Impl_::idempotency_level_));
}